

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **args)

{
  size_t *this;
  element_type *s;
  vector<ErrorInfoException,_std::allocator<ErrorInfoException>_> *pvVar1;
  vector<Token,_std::allocator<Token>_> *v;
  set<Symbol,_std::less<Symbol>,_std::allocator<Symbol>_> *v_00;
  char *local_290;
  vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_> local_288;
  undefined1 local_270 [8];
  lexical lexical;
  Table table;
  undefined1 local_80 [8];
  pair<std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
  lines;
  allocator local_39;
  string local_38 [8];
  string filename;
  char **args_local;
  int argc_local;
  
  if (argc < 2) {
    local_290 = "code.java";
  }
  else {
    local_290 = args[1];
  }
  filename.field_2._8_8_ = args;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,local_290,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  readCode((string *)&table.escape_chars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  s = std::
      __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ::get((__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             *)&table.escape_chars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  StringLine::convert_string
            ((pair<std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
              *)local_80,s);
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&table.escape_chars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  this = &lexical.symbols._M_t._M_impl.super__Rb_tree_header._M_node_count;
  Table::Table((Table *)this);
  Table::load_all((Table *)this);
  ::lexical::lexical((lexical *)local_270,
                     (Table *)&lexical.symbols._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>::vector
            (&local_288,
             (vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_> *)
             local_80);
  ::lexical::analyse((lexical *)local_270,&local_288);
  std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>::~vector
            (&local_288);
  pvVar1 = ::lexical::get_errors((lexical *)local_270);
  print_code((vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_> *)
             local_80,pvVar1);
  pvVar1 = ::lexical::get_errors((lexical *)local_270);
  print_errors(pvVar1);
  v = ::lexical::get_tokens((lexical *)local_270);
  print_token(v);
  v_00 = ::lexical::get_symbols((lexical *)local_270);
  print_symbols(v_00);
  ::lexical::~lexical((lexical *)local_270);
  Table::~Table((Table *)&lexical.symbols._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  pair<std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
  ::~pair((pair<std::vector<std::shared_ptr<StringLine>,_std::allocator<std::shared_ptr<StringLine>_>_>,_std::vector<ErrorInfoException,_std::allocator<ErrorInfoException>_>_>
           *)local_80);
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main(int argc, char **args) {
    string filename = argc < 2 ? "code.java" : args[1];

    /**
     * 去除注释
     */
    auto lines = StringLine::convert_string(readCode(filename).get());
    /**
     * 加载 关键字、运算符、分隔符表
     */
    Table table;
    table.load_all();
    /**
     * 调用词法分析器
     */
    lexical lexical(table);
    lexical.analyse(lines.first);


    print_code(lines.first, lexical.get_errors());
    print_errors(lexical.get_errors());
    print_token(lexical.get_tokens());
    print_symbols(lexical.get_symbols());
}